

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trees.c
# Opt level: O0

void compress_block(deflate_state *s,ct_data *ltree,ct_data *dtree)

{
  byte bVar1;
  ushort uVar2;
  int iVar3;
  ulg uVar4;
  int iVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  uint local_68;
  int val_5;
  int len_5;
  int val_4;
  int len_4;
  int val_3;
  int len_3;
  int val_2;
  int len_2;
  int val_1;
  int len_1;
  int val;
  int len;
  int extra;
  uint code;
  uint sx;
  int lc;
  uint dist;
  ct_data *dtree_local;
  ct_data *ltree_local;
  deflate_state *s_local;
  
  extra = 0;
  if (s->sym_next != 0) {
    do {
      uVar8 = extra + 2;
      iVar5 = (uint)s->sym_buf[extra + 1] * 0x100 + (uint)s->sym_buf[(uint)extra];
      extra = extra + 3;
      uVar8 = (uint)s->sym_buf[uVar8];
      if (iVar5 == 0) {
        uVar6 = (uint)ltree[(int)uVar8].dl.dad;
        if ((int)(0x10 - uVar6) < s->bi_valid) {
          uVar2 = ltree[(int)uVar8].fc.freq;
          s->bi_buf = s->bi_buf | uVar2 << ((byte)s->bi_valid & 0x1f);
          uVar4 = s->pending;
          s->pending = uVar4 + 1;
          s->pending_buf[uVar4] = (Bytef)s->bi_buf;
          uVar4 = s->pending;
          s->pending = uVar4 + 1;
          s->pending_buf[uVar4] = (Bytef)(s->bi_buf >> 8);
          s->bi_buf = (ush)((int)(uint)uVar2 >> (0x10U - (char)s->bi_valid & 0x1f));
          s->bi_valid = (uVar6 - 0x10) + s->bi_valid;
        }
        else {
          s->bi_buf = s->bi_buf | ltree[(int)uVar8].fc.freq << ((byte)s->bi_valid & 0x1f);
          s->bi_valid = uVar6 + s->bi_valid;
        }
      }
      else {
        uVar6 = (uint)""[(int)uVar8];
        uVar7 = (uint)ltree[uVar6 + 0x101].dl.dad;
        if ((int)(0x10 - uVar7) < s->bi_valid) {
          uVar2 = ltree[uVar6 + 0x101].fc.freq;
          s->bi_buf = s->bi_buf | uVar2 << ((byte)s->bi_valid & 0x1f);
          uVar4 = s->pending;
          s->pending = uVar4 + 1;
          s->pending_buf[uVar4] = (Bytef)s->bi_buf;
          uVar4 = s->pending;
          s->pending = uVar4 + 1;
          s->pending_buf[uVar4] = (Bytef)(s->bi_buf >> 8);
          s->bi_buf = (ush)((int)(uint)uVar2 >> (0x10U - (char)s->bi_valid & 0x1f));
          s->bi_valid = (uVar7 - 0x10) + s->bi_valid;
        }
        else {
          s->bi_buf = s->bi_buf | ltree[uVar6 + 0x101].fc.freq << ((byte)s->bi_valid & 0x1f);
          s->bi_valid = uVar7 + s->bi_valid;
        }
        iVar3 = extra_lbits[uVar6];
        if (iVar3 != 0) {
          uVar8 = uVar8 - base_length[uVar6];
          if (0x10 - iVar3 < s->bi_valid) {
            s->bi_buf = s->bi_buf | (ushort)((uVar8 & 0xffff) << ((byte)s->bi_valid & 0x1f));
            uVar4 = s->pending;
            s->pending = uVar4 + 1;
            s->pending_buf[uVar4] = (Bytef)s->bi_buf;
            uVar4 = s->pending;
            s->pending = uVar4 + 1;
            s->pending_buf[uVar4] = (Bytef)(s->bi_buf >> 8);
            s->bi_buf = (ush)((int)(uVar8 & 0xffff) >> (0x10U - (char)s->bi_valid & 0x1f));
            s->bi_valid = iVar3 + -0x10 + s->bi_valid;
          }
          else {
            s->bi_buf = s->bi_buf | (ushort)((uVar8 & 0xffff) << ((byte)s->bi_valid & 0x1f));
            s->bi_valid = iVar3 + s->bi_valid;
          }
        }
        uVar8 = iVar5 - 1;
        if (uVar8 < 0x100) {
          bVar1 = ""[uVar8];
        }
        else {
          bVar1 = ""[(uVar8 >> 7) + 0x100];
        }
        local_68 = (uint)bVar1;
        uVar6 = (uint)dtree[local_68].dl.dad;
        if ((int)(0x10 - uVar6) < s->bi_valid) {
          uVar2 = dtree[local_68].fc.freq;
          s->bi_buf = s->bi_buf | uVar2 << ((byte)s->bi_valid & 0x1f);
          uVar4 = s->pending;
          s->pending = uVar4 + 1;
          s->pending_buf[uVar4] = (Bytef)s->bi_buf;
          uVar4 = s->pending;
          s->pending = uVar4 + 1;
          s->pending_buf[uVar4] = (Bytef)(s->bi_buf >> 8);
          s->bi_buf = (ush)((int)(uint)uVar2 >> (0x10U - (char)s->bi_valid & 0x1f));
          s->bi_valid = (uVar6 - 0x10) + s->bi_valid;
        }
        else {
          s->bi_buf = s->bi_buf | dtree[local_68].fc.freq << ((byte)s->bi_valid & 0x1f);
          s->bi_valid = uVar6 + s->bi_valid;
        }
        iVar5 = extra_dbits[local_68];
        if (iVar5 != 0) {
          uVar8 = uVar8 - base_dist[local_68];
          if (0x10 - iVar5 < s->bi_valid) {
            s->bi_buf = s->bi_buf | (ushort)((uVar8 & 0xffff) << ((byte)s->bi_valid & 0x1f));
            uVar4 = s->pending;
            s->pending = uVar4 + 1;
            s->pending_buf[uVar4] = (Bytef)s->bi_buf;
            uVar4 = s->pending;
            s->pending = uVar4 + 1;
            s->pending_buf[uVar4] = (Bytef)(s->bi_buf >> 8);
            s->bi_buf = (ush)((int)(uVar8 & 0xffff) >> (0x10U - (char)s->bi_valid & 0x1f));
            s->bi_valid = iVar5 + -0x10 + s->bi_valid;
          }
          else {
            s->bi_buf = s->bi_buf | (ushort)((uVar8 & 0xffff) << ((byte)s->bi_valid & 0x1f));
            s->bi_valid = iVar5 + s->bi_valid;
          }
        }
      }
    } while ((uint)extra < s->sym_next);
  }
  uVar8 = (uint)ltree[0x100].dl.dad;
  if ((int)(0x10 - uVar8) < s->bi_valid) {
    uVar2 = ltree[0x100].fc.freq;
    s->bi_buf = s->bi_buf | uVar2 << ((byte)s->bi_valid & 0x1f);
    uVar4 = s->pending;
    s->pending = uVar4 + 1;
    s->pending_buf[uVar4] = (Bytef)s->bi_buf;
    uVar4 = s->pending;
    s->pending = uVar4 + 1;
    s->pending_buf[uVar4] = (Bytef)(s->bi_buf >> 8);
    s->bi_buf = (ush)((int)(uint)uVar2 >> (0x10U - (char)s->bi_valid & 0x1f));
    s->bi_valid = (uVar8 - 0x10) + s->bi_valid;
  }
  else {
    s->bi_buf = s->bi_buf | ltree[0x100].fc.freq << ((byte)s->bi_valid & 0x1f);
    s->bi_valid = uVar8 + s->bi_valid;
  }
  return;
}

Assistant:

local void compress_block(s, ltree, dtree)
    deflate_state *s;
    const ct_data *ltree; /* literal tree */
    const ct_data *dtree; /* distance tree */
{
    unsigned dist;      /* distance of matched string */
    int lc;             /* match length or unmatched char (if dist == 0) */
    unsigned sx = 0;    /* running index in sym_buf */
    unsigned code;      /* the code to send */
    int extra;          /* number of extra bits to send */

    if (s->sym_next != 0) do {
        dist = s->sym_buf[sx++] & 0xff;
        dist += (unsigned)(s->sym_buf[sx++] & 0xff) << 8;
        lc = s->sym_buf[sx++];
        if (dist == 0) {
            send_code(s, lc, ltree); /* send a literal byte */
            Tracecv(isgraph(lc), (stderr," '%c' ", lc));
        } else {
            /* Here, lc is the match length - MIN_MATCH */
            code = _length_code[lc];
            send_code(s, code+LITERALS+1, ltree); /* send the length code */
            extra = extra_lbits[code];
            if (extra != 0) {
                lc -= base_length[code];
                send_bits(s, lc, extra);       /* send the extra length bits */
            }
            dist--; /* dist is now the match distance - 1 */
            code = d_code(dist);
            Assert (code < D_CODES, "bad d_code");

            send_code(s, code, dtree);       /* send the distance code */
            extra = extra_dbits[code];
            if (extra != 0) {
                dist -= (unsigned)base_dist[code];
                send_bits(s, dist, extra);   /* send the extra distance bits */
            }
        } /* literal or match pair ? */

        /* Check that the overlay between pending_buf and sym_buf is ok: */
        Assert(s->pending < s->lit_bufsize + sx, "pendingBuf overflow");

    } while (sx < s->sym_next);

    send_code(s, END_BLOCK, ltree);
}